

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O2

void subflow_task(uint W)

{
  char *pcVar1;
  code *pcVar2;
  double dVar3;
  FlowBuilder FVar4;
  char extraout_AL;
  char extraout_AL_00;
  int iVar5;
  bool bVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ResultBuilder DOCTEST_RB;
  Future<void> local_258;
  shared_ptr<tf::WorkerInterface> local_238;
  Taskflow taskflow;
  Executor executor;
  
  tf::Taskflow::Taskflow(&taskflow);
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_238.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  iVar5 = 100;
  while (FVar4._graph = taskflow.super_FlowBuilder._graph, bVar6 = iVar5 != 0, iVar5 = iVar5 + -1,
        bVar6) {
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
    *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
         &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
    *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
    *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
    pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
    (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
    *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
    *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
    *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
         &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
    *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
    *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
         (char *)std::
                 _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:239:22)>
                 ::_M_invoke;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
         (double)std::
                 _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:239:22)>
                 ::_M_manager;
    *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_line = 0;
    *(undefined8 *)((long)&DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0 + 8) = 0;
    *(undefined8 *)((long)&DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0 + 0x10) = 0;
    *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 3;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  }
  if (*(char *)(doctest::detail::g_cs + 0x72) == '\0') {
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE_THROWS_WITH_AS;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0xf5;
    DOCTEST_RB.super_AssertData.m_expr = "executor.run(taskflow).get()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "std::runtime_error";
    DOCTEST_RB.super_AssertData.m_exception_string = "x";
    tf::Executor::run(&local_258,&executor,&taskflow);
    std::future<void>::get(&local_258.super_future<void>);
    tf::Future<void>::~Future(&local_258);
    dVar3 = doctest::detail::ResultBuilder::log
                      (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  }
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::clear(&taskflow._graph.
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         );
  iVar5 = 100;
  while (FVar4._graph = taskflow.super_FlowBuilder._graph, bVar6 = iVar5 != 0, iVar5 = iVar5 + -1,
        bVar6) {
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
    ((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr = (char *)0x0;
    *(uint **)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 8) =
         &(DOCTEST_RB.super_AssertData.m_test_case)->m_line;
    *(undefined8 *)((long)&((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0 + 0x10) = 0;
    *(undefined1 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_line = 0;
    pcVar1 = (char *)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 0x10);
    (DOCTEST_RB.super_AssertData.m_test_case)->m_test_suite = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_description = (char *)0x0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_skip = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_breaks = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_no_output = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_may_fail = false;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_should_fail = false;
    *(undefined3 *)&(DOCTEST_RB.super_AssertData.m_test_case)->field_0x3d = 0;
    *(undefined8 *)&(DOCTEST_RB.super_AssertData.m_test_case)->m_expected_failures = 0;
    (DOCTEST_RB.super_AssertData.m_test_case)->m_timeout = (double)pcVar1;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0.data.ptr = pcVar1;
    *(char ***)((long)&DOCTEST_RB.super_AssertData.m_test_case[1].m_file.field_0 + 8) =
         &DOCTEST_RB.super_AssertData.m_test_case[1].m_description;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_description = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_skip = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_breaks = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_no_output = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_may_fail = false;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_should_fail = false;
    *(undefined3 *)&DOCTEST_RB.super_AssertData.m_test_case[1].field_0x3d = 0;
    *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[1].m_expected_failures = 0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0.data.ptr =
         (char *)std::
                 _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:251:22)>
                 ::_M_invoke;
    DOCTEST_RB.super_AssertData.m_test_case[1].m_timeout =
         (double)std::
                 _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:251:22)>
                 ::_M_manager;
    *(undefined8 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_line = 0;
    *(undefined8 *)((long)&DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0 + 8) = 0;
    *(undefined8 *)((long)&DOCTEST_RB.super_AssertData.m_test_case[2].m_file.field_0 + 0x10) = 0;
    *(undefined1 *)&DOCTEST_RB.super_AssertData.m_test_case[2].m_name = 3;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_test_suite = (char *)0x0;
    DOCTEST_RB.super_AssertData.m_test_case[2].m_description = (char *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&DOCTEST_RB);
  }
  if (*(char *)(doctest::detail::g_cs + 0x72) == '\0') {
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE_THROWS_WITH_AS;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x100;
    DOCTEST_RB.super_AssertData.m_expr = "executor.run(taskflow).get()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "std::runtime_error";
    DOCTEST_RB.super_AssertData.m_exception_string = "y";
    tf::Executor::run(&local_258,&executor,&taskflow);
    std::future<void>::get(&local_258.super_future<void>);
    tf::Future<void>::~Future(&local_258);
    dVar3 = doctest::detail::ResultBuilder::log
                      (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (extraout_AL_00 != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  }
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void subflow_task(unsigned W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);
  
  // subflow work throws
  for(int i=0; i<100; i++) {
    taskflow.emplace([](tf::Subflow& sf){
      throw std::runtime_error("x");
      sf.emplace([](){});
      sf.emplace([](){ throw std::runtime_error("z"); });
    });
  }
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "x", std::runtime_error);

  taskflow.clear();
  
  // subflow's task throws
  for(int i=0; i<100; i++) {
    taskflow.emplace([](tf::Subflow& sf){
      sf.emplace([](){});
      sf.emplace([](){ throw std::runtime_error("y"); });
    });
  }
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "y", std::runtime_error);
}